

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int add_func_var(JSContext *ctx,JSFunctionDef *fd,JSAtom name)

{
  long lVar1;
  long in_RSI;
  undefined8 in_RDI;
  int idx;
  int local_18;
  
  local_18 = *(int *)(in_RSI + 0xc4);
  if ((local_18 < 0) &&
     (local_18 = add_var((JSContext *)fd,(JSFunctionDef *)CONCAT44(name,idx),
                         (JSAtom)((ulong)in_RDI >> 0x20)), -1 < local_18)) {
    *(int *)(in_RSI + 0xc4) = local_18;
    lVar1 = *(long *)(in_RSI + 0x90) + (long)local_18 * 0x10;
    *(uint *)(lVar1 + 0xc) = *(uint *)(lVar1 + 0xc) & 0xffffff87 | 0x20;
    if ((*(byte *)(in_RSI + 0x86) & 1) != 0) {
      lVar1 = *(long *)(in_RSI + 0x90) + (long)local_18 * 0x10;
      *(uint *)(lVar1 + 0xc) = *(uint *)(lVar1 + 0xc) & 0xfffffffe | 1;
    }
  }
  return local_18;
}

Assistant:

static int add_func_var(JSContext *ctx, JSFunctionDef *fd, JSAtom name)
{
    int idx = fd->func_var_idx;
    if (idx < 0 && (idx = add_var(ctx, fd, name)) >= 0) {
        fd->func_var_idx = idx;
        fd->vars[idx].var_kind = JS_VAR_FUNCTION_NAME;
        if (fd->js_mode & JS_MODE_STRICT)
            fd->vars[idx].is_const = TRUE;
    }
    return idx;
}